

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

int countint(TValue *key,int *nums)

{
  int iVar1;
  uint x;
  
  iVar1 = arrayindex(key);
  x = iVar1 - 1;
  if (x < 0x40000000) {
    iVar1 = luaO_log2(x);
    nums[(long)iVar1 + 1] = nums[(long)iVar1 + 1] + 1;
  }
  return (uint)(x < 0x40000000);
}

Assistant:

static int countint(const TValue*key,int*nums){
int k=arrayindex(key);
if(0<k&&k<=(1<<(32-2))){
nums[ceillog2(k)]++;
return 1;
}
else
return 0;
}